

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_writeValueInfo
                 (qpTestLog *log,char *name,char *description,char *unit,qpSampleValueTag tag)

{
  deBool dVar1;
  char *value;
  long lVar2;
  undefined1 local_148 [16];
  char *local_138;
  char *local_130;
  undefined1 local_128 [16];
  char *local_118;
  char *local_110;
  undefined1 local_108 [16];
  char *local_f8;
  char *local_f0;
  undefined1 local_e8 [16];
  char *local_d8;
  char *local_d0;
  undefined1 local_c8 [8];
  qpXmlAttribute attribs [4];
  int numAttribs;
  char *tagName;
  qpSampleValueTag tag_local;
  char *unit_local;
  char *description_local;
  char *name_local;
  qpTestLog *log_local;
  
  value = qpLookupString(s_qpSampleValueTagMap,3,tag);
  attribs[3].boolValue = 0;
  deMutex_lock(log->lock);
  lVar2 = (long)attribs[3].boolValue;
  attribs[3].boolValue = attribs[3].boolValue + 1;
  qpSetStringAttrib((qpXmlAttribute *)local_e8,"Name",name);
  attribs[lVar2 + -1].intValue = local_e8._0_4_;
  attribs[lVar2 + -1].boolValue = local_e8._4_4_;
  attribs[lVar2].name = (char *)local_e8._8_8_;
  *(char **)&attribs[lVar2].type = local_d8;
  attribs[lVar2].stringValue = local_d0;
  lVar2 = (long)attribs[3].boolValue;
  attribs[3].boolValue = attribs[3].boolValue + 1;
  qpSetStringAttrib((qpXmlAttribute *)local_108,"Description",description);
  attribs[lVar2 + -1].intValue = local_108._0_4_;
  attribs[lVar2 + -1].boolValue = local_108._4_4_;
  attribs[lVar2].name = (char *)local_108._8_8_;
  *(char **)&attribs[lVar2].type = local_f8;
  attribs[lVar2].stringValue = local_f0;
  lVar2 = (long)attribs[3].boolValue;
  attribs[3].boolValue = attribs[3].boolValue + 1;
  qpSetStringAttrib((qpXmlAttribute *)local_128,"Tag",value);
  attribs[lVar2 + -1].intValue = local_128._0_4_;
  attribs[lVar2 + -1].boolValue = local_128._4_4_;
  attribs[lVar2].name = (char *)local_128._8_8_;
  *(char **)&attribs[lVar2].type = local_118;
  attribs[lVar2].stringValue = local_110;
  if (unit != (char *)0x0) {
    lVar2 = (long)attribs[3].boolValue;
    attribs[3].boolValue = attribs[3].boolValue + 1;
    qpSetStringAttrib((qpXmlAttribute *)local_148,"Unit",unit);
    attribs[lVar2 + -1].intValue = local_148._0_4_;
    attribs[lVar2 + -1].boolValue = local_148._4_4_;
    attribs[lVar2].name = (char *)local_148._8_8_;
    *(char **)&attribs[lVar2].type = local_138;
    attribs[lVar2].stringValue = local_130;
  }
  dVar1 = qpXmlWriter_startElement
                    (log->writer,"ValueInfo",attribs[3].boolValue,(qpXmlAttribute *)local_c8);
  if ((dVar1 != 0) && (dVar1 = qpXmlWriter_endElement(log->writer,"ValueInfo"), dVar1 != 0)) {
    deMutex_unlock(log->lock);
    return 1;
  }
  qpPrintf("qpTestLog_writeValueInfo(): Writing XML failed\n");
  deMutex_unlock(log->lock);
  return 0;
}

Assistant:

deBool qpTestLog_writeValueInfo (qpTestLog* log, const char* name, const char* description, const char* unit, qpSampleValueTag tag)
{
	const char*		tagName		= QP_LOOKUP_STRING(s_qpSampleValueTagMap, tag);
	int				numAttribs	= 0;
	qpXmlAttribute	attribs[4];

	DE_ASSERT(log && name && description && tagName);
	deMutex_lock(log->lock);

	DE_ASSERT(ContainerStack_getTop(&log->containerStack) == CONTAINERTYPE_SAMPLEINFO);

	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	attribs[numAttribs++] = qpSetStringAttrib("Description", description);
	attribs[numAttribs++] = qpSetStringAttrib("Tag", tagName);

	if (unit)
		attribs[numAttribs++] = qpSetStringAttrib("Unit", unit);

	if (!qpXmlWriter_startElement(log->writer, "ValueInfo", numAttribs, attribs) ||
		!qpXmlWriter_endElement(log->writer, "ValueInfo"))
	{
		qpPrintf("qpTestLog_writeValueInfo(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}